

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *p;
  Select *pExpr_00;
  u8 uVar2;
  uint uVar3;
  int in2;
  Expr *pExpr_01;
  Select *pSVar4;
  int iVar5;
  Op *pOVar6;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  int regFree2;
  int regFree1;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) goto LAB_0017bdaa;
  bVar1 = pExpr->op;
  uVar3 = (uint)bVar1;
  if (0xf < uVar3 - 0x2b) {
    if (uVar3 == 0x13) {
      pExpr_01 = pExpr->pLeft;
    }
    else {
      if (uVar3 != 0xaf) goto switchD_0017bb17_caseD_2f;
      bVar8 = pExpr->op2 == '.';
      uVar3 = sqlite3ExprTruthValue(pExpr->pRight);
      jumpIfNull = (uint)!bVar8 << 4;
      pExpr_01 = pExpr->pLeft;
      if (uVar3 != bVar8) goto LAB_0017bd29;
    }
    sqlite3ExprIfTrue(pParse,pExpr_01,dest,jumpIfNull);
    goto LAB_0017bd6c;
  }
  iVar7 = (uVar3 + 1 ^ 1) - 1;
  switch(uVar3) {
  case 0x2b:
  case 0x2c:
    pExpr_01 = sqlite3ExprSimplifiedAndOr(pExpr);
    if (pExpr_01 == pExpr) {
      if (bVar1 != 0x2c) {
        iVar7 = pParse->nLabel + -1;
        pParse->nLabel = iVar7;
        sqlite3ExprIfTrue(pParse,pExpr->pLeft,iVar7,jumpIfNull ^ 0x10);
        sqlite3ExprIfFalse(pParse,pExpr->pRight,dest,jumpIfNull);
        goto LAB_0017be1f;
      }
      sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
      pExpr_01 = pExpr->pRight;
    }
LAB_0017bd29:
    sqlite3ExprIfFalse(pParse,pExpr_01,dest,jumpIfNull);
    break;
  case 0x2d:
  case 0x2e:
    iVar7 = (bVar1 != 0x2d) + 0x35;
    jumpIfNull = 0x80;
  default:
    pExpr_00 = (Select *)pExpr->pLeft;
    uVar2 = pExpr_00->op;
    if (uVar2 == 0xb0) {
      uVar2 = *(u8 *)&pExpr_00->nSelectRow;
    }
    pSVar4 = pExpr_00;
    if (uVar2 == 0xb1) {
LAB_0017bbec:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar4->pEList)->pList->nExpr) {
switchD_0017bb17_caseD_2f:
        if ((pExpr->flags & 0x20000001) == 0x20000000) {
          iVar7 = 9;
          iVar5 = 0;
LAB_0017bd64:
          uVar3 = 0;
        }
        else {
          if ((pExpr->flags & 0x10000001) == 0x10000000) break;
          iVar5 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
          uVar3 = (uint)(jumpIfNull != 0);
          iVar7 = 0x11;
        }
        sqlite3VdbeAddOp3(p,iVar7,iVar5,dest,uVar3);
        break;
      }
    }
    else if (uVar2 == 0x8b) {
      pSVar4 = ((anon_union_8_2_a01b6dbf_for_x *)&pExpr_00->pEList)->pSelect;
      goto LAB_0017bbec;
    }
    iVar5 = sqlite3ExprCodeTemp(pParse,(Expr *)pExpr_00,&regFree1);
    in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pExpr->pLeft,pExpr->pRight,iVar7,iVar5,in2,dest,jumpIfNull,
                pExpr->flags >> 10 & 1);
    break;
  case 0x2f:
  case 0x30:
    goto switchD_0017bb17_caseD_2f;
  case 0x31:
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfFalse,jumpIfNull);
    break;
  case 0x32:
    if (jumpIfNull == 0) {
      iVar7 = pParse->nLabel + -1;
      pParse->nLabel = iVar7;
      sqlite3ExprCodeIN(pParse,pExpr,dest,iVar7);
LAB_0017be1f:
      sqlite3VdbeResolveLabel(p,iVar7);
    }
    else {
      sqlite3ExprCodeIN(pParse,pExpr,dest,dest);
    }
    break;
  case 0x33:
  case 0x34:
    iVar5 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    if (p->db->mallocFailed == '\0') {
      pOVar6 = p->aOp + (long)p->nOp + -1;
    }
    else {
      pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if ((pOVar6->p3 == iVar5) && (pOVar6->opcode == '^')) {
      *(byte *)&pOVar6->p5 = (byte)pOVar6->p5 | 0x80;
    }
    goto LAB_0017bd64;
  }
LAB_0017bd6c:
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
LAB_0017bdaa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;
  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND:
    case TK_OR: {
      Expr *pAlt = sqlite3ExprSimplifiedAndOr(pExpr);
      if( pAlt!=pExpr ){
        sqlite3ExprIfFalse(pParse, pAlt, dest, jumpIfNull);
      }else if( pExpr->op==TK_AND ){
        testcase( jumpIfNull==0 );
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
        sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      }else{
        int d2 = sqlite3VdbeMakeLabel(pParse);
        testcase( jumpIfNull==0 );
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2,
                          jumpIfNull^SQLITE_JUMPIFNULL);
        sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
        sqlite3VdbeResolveLabel(v, d2);
      }
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;   /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;  /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        /* IS TRUE and IS NOT FALSE */
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? 0 : SQLITE_JUMPIFNULL);

      }else{
        /* IS FALSE and IS NOT TRUE */
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? 0 : SQLITE_JUMPIFNULL);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      jumpIfNull = SQLITE_NULLEQ;
      /* no break */ deliberate_fall_through
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull,ExprHasProperty(pExpr,EP_Commuted));
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeTypeofColumn(v, r1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( op==TK_ISNULL );   VdbeCoverageIf(v, op==TK_ISNULL);
      testcase( op==TK_NOTNULL );  VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfFalse, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(pParse);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
    default_expr:
      if( ExprAlwaysFalse(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( ExprAlwaysTrue(pExpr) ){
        /* no-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}